

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventdispatcher_unix.cpp
# Opt level: O3

bool __thiscall
QEventDispatcherUNIX::processEvents(QEventDispatcherUNIX *this,ProcessEventsFlags flags)

{
  QList<pollfd> *this_00;
  qsizetype *pqVar1;
  byte bVar2;
  QEventDispatcherUNIXPrivate *this_01;
  QThreadData *data;
  Entry *pEVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  pointer fds;
  iterator iVar9;
  ulong uVar10;
  qsizetype asize;
  uint uVar11;
  Data *pDVar12;
  undefined8 uVar13;
  pollfd pVar14;
  long in_FS_OFFSET;
  bool bVar15;
  QDeadlineTimer deadline;
  optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> oVar16;
  QDeadlineTimer local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar13._0_4_ = 0;
  uVar13._4_4_ = 1;
  this_01 = *(QEventDispatcherUNIXPrivate **)(this + 8);
  (this_01->interrupt).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  QAbstractEventDispatcher::awake((QAbstractEventDispatcher *)this);
  data = (this_01->super_QAbstractEventDispatcherPrivate).super_QObjectPrivate.threadData.
         super_QBasicAtomicPointer<QThreadData>._q_value._M_b._M_p;
  QCoreApplicationPrivate::sendPostedEvents((QObject *)0x0,0,data);
  bVar6 = QThreadData::canWaitLocked(data);
  if (bVar6) {
    bVar6 = ((uint)flags.super_QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>.
                   super_QFlagsStorage<QEventLoop::ProcessEventsFlag>.i & 4) != 0;
    bVar15 = (this_01->interrupt).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0;
    if (bVar15 && bVar6) {
      QAbstractEventDispatcher::aboutToBlock((QAbstractEventDispatcher *)this);
    }
    if ((this_01->interrupt).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i != 0) {
      pVar14.fd = 0;
      pVar14.events = 0;
      pVar14.revents = 0;
      goto LAB_003c28b9;
    }
    pVar14.fd = 0;
    pVar14.events = 0;
    pVar14.revents = 0;
    if (bVar15 && bVar6) {
      pVar14.fd = -1;
      pVar14.events = -1;
      pVar14.revents = 0x7fff;
    }
    if ((char)(((uint)flags.super_QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>.
                      super_QFlagsStorage<QEventLoop::ProcessEventsFlag>.i & 8) >> 3) == '\0' &&
        (bVar15 && bVar6)) {
      oVar16 = QTimerInfoList::timerWait(&this_01->timerList);
      if (((undefined1  [16])
           oVar16.
           super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>
           ._M_payload.
           super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        local_48.t1._0_4_ = -1;
        local_48.t1._4_2_ = -1;
        local_48.t1._6_2_ = 0x7fff;
        local_48.t2 = 0;
        local_48.type = 1;
        uVar13 = local_48._8_8_;
        pVar14 = (pollfd)local_48.t1;
      }
      else {
        local_48.t1._0_4_ = 0;
        local_48.t1._4_2_ = 0;
        local_48.t1._6_2_ = 0;
        local_48.t2 = 0;
        local_48.type = 1;
        if (oVar16.
            super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>
            ._M_payload.
            super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            ._M_payload ==
            (_Storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true>)
            0x7fffffffffffffff) {
          local_48.t1._0_4_ = -1;
          local_48.t1._4_2_ = -1;
          local_48.t1._6_2_ = 0x7fff;
          local_48.t2 = 0;
          local_48.type = 1;
          uVar13 = local_48._8_8_;
          pVar14 = (pollfd)local_48.t1;
        }
        else {
          QDeadlineTimer::setPreciseRemainingTime
                    (&local_48,0,
                     (qint64)oVar16.
                             super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             ._M_payload,CoarseTimer);
          uVar13 = local_48._8_8_;
          pVar14 = (pollfd)local_48.t1;
        }
      }
    }
  }
  else {
    pVar14.fd = 0;
    pVar14.events = 0;
    pVar14.revents = 0;
    if ((this_01->interrupt).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i != 0) goto LAB_003c28b9;
  }
  this_00 = &this_01->pollfds;
  QList<pollfd>::clear(this_00);
  if (((uint)flags.super_QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>.
             super_QFlagsStorage<QEventLoop::ProcessEventsFlag>.i & 2) == 0) {
    pDVar12 = (this_01->socketNotifiers).d;
    if (pDVar12 == (Data *)0x0) {
      asize = 1;
    }
    else {
      asize = pDVar12->size + 1;
    }
    QList<pollfd>::reserve(this_00,asize);
    pDVar12 = (this_01->socketNotifiers).d;
    if (pDVar12 == (Data *)0x0) {
      pDVar12 = (Data *)0x0;
      uVar10 = 0;
LAB_003c271f:
      if (pDVar12 == (Data *)0x0 && uVar10 == 0) goto LAB_003c27f0;
    }
    else {
      if (pDVar12->spans->offsets[0] == 0xff) {
        uVar5 = 1;
        do {
          uVar10 = uVar5;
          if (pDVar12->numBuckets == uVar10) {
            pDVar12 = (Data *)0x0;
            uVar10 = 0;
            break;
          }
          uVar5 = uVar10 + 1;
        } while (pDVar12->spans[uVar10 >> 7].offsets[(uint)uVar10 & 0x7f] == 0xff);
        goto LAB_003c271f;
      }
      uVar10 = 0;
    }
    do {
      pEVar3 = pDVar12->spans[uVar10 >> 7].entries;
      bVar2 = pDVar12->spans[uVar10 >> 7].offsets[(uint)uVar10 & 0x7f];
      bVar6 = *(long *)(pEVar3[bVar2].storage.data + 8) != 0;
      uVar11 = bVar6 + 4;
      if (*(long *)(pEVar3[bVar2].storage.data + 0x10) == 0) {
        uVar11 = (uint)bVar6;
      }
      uVar4 = uVar11 + 2;
      if (*(long *)(pEVar3[bVar2].storage.data + 0x18) == 0) {
        uVar4 = uVar11;
      }
      local_48.t1 = CONCAT44(uVar4,*(undefined4 *)pEVar3[bVar2].storage.data);
      QtPrivate::QPodArrayOps<pollfd>::emplace<pollfd>
                ((QPodArrayOps<pollfd> *)this_00,(this_01->pollfds).d.size,(pollfd *)&local_48);
      QList<pollfd>::end(this_00);
      do {
        if (pDVar12->numBuckets - 1 == uVar10) {
          pDVar12 = (Data *)0x0;
          uVar10 = 0;
          break;
        }
        uVar10 = uVar10 + 1;
      } while (pDVar12->spans[uVar10 >> 7].offsets[(uint)uVar10 & 0x7f] == 0xff);
    } while ((pDVar12 != (Data *)0x0) || (uVar10 != 0));
  }
  else {
    QList<pollfd>::reserve(this_00,1);
  }
LAB_003c27f0:
  local_48.t1 = (ulong)*(uint *)&(this_01->super_QAbstractEventDispatcherPrivate).field_0x94 |
                0x100000000;
  QtPrivate::QPodArrayOps<pollfd>::emplace<pollfd>
            ((QPodArrayOps<pollfd> *)this_00,(this_01->pollfds).d.size,(pollfd *)&local_48);
  QList<pollfd>::end(this_00);
  fds = QList<pollfd>::data(this_00);
  deadline.t2 = (uint)uVar13;
  deadline.type = SUB84(uVar13,4);
  deadline.t1._0_4_ = pVar14.fd;
  deadline.t1._4_2_ = pVar14.events;
  deadline.t1._6_2_ = pVar14.revents;
  iVar7 = qt_safe_poll(fds,(this_01->pollfds).d.size,deadline);
  if (iVar7 == 0) {
    iVar7 = 0;
  }
  else if (iVar7 == -1) {
    iVar7 = 0;
    qErrnoWarning("qt_safe_poll");
  }
  else {
    iVar9 = QList<pollfd>::end(this_00);
    local_48.t1 = *(qint64 *)(iVar9.i + -1);
    pqVar1 = &(this_01->pollfds).d.size;
    *pqVar1 = *pqVar1 + -1;
    iVar7 = QThreadPipe::check((QThreadPipe *)
                               &(this_01->super_QAbstractEventDispatcherPrivate).field_0x94,
                               (pollfd *)&local_48);
    if (((uint)flags.super_QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>.
               super_QFlagsStorage<QEventLoop::ProcessEventsFlag>.i & 2) == 0) {
      iVar8 = QEventDispatcherUNIXPrivate::activateSocketNotifiers(this_01);
      iVar7 = iVar7 + iVar8;
    }
  }
  if (((uint)flags.super_QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>.
             super_QFlagsStorage<QEventLoop::ProcessEventsFlag>.i & 8) == 0) {
    iVar8 = QTimerInfoList::activateTimers(&this_01->timerList);
    iVar7 = iVar7 + iVar8;
  }
  pVar14._1_7_ = 0;
  pVar14.fd._0_1_ = 0 < iVar7;
LAB_003c28b9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pVar14.fd._0_1_;
}

Assistant:

bool QEventDispatcherUNIX::processEvents(QEventLoop::ProcessEventsFlags flags)
{
    Q_D(QEventDispatcherUNIX);
    d->interrupt.storeRelaxed(0);

    // we are awake, broadcast it
    emit awake();

    auto threadData = d->threadData.loadRelaxed();
    QCoreApplicationPrivate::sendPostedEvents(nullptr, 0, threadData);

    const bool include_timers = (flags & QEventLoop::X11ExcludeTimers) == 0;
    const bool include_notifiers = (flags & QEventLoop::ExcludeSocketNotifiers) == 0;
    const bool wait_for_events = (flags & QEventLoop::WaitForMoreEvents) != 0;

    const bool canWait = (threadData->canWaitLocked()
                          && !d->interrupt.loadRelaxed()
                          && wait_for_events);

    if (canWait)
        emit aboutToBlock();

    if (d->interrupt.loadRelaxed())
        return false;

    QDeadlineTimer deadline;
    if (canWait) {
        if (include_timers) {
            std::optional<nanoseconds> remaining = d->timerList.timerWait();
            deadline = remaining ? QDeadlineTimer{*remaining}
                             : QDeadlineTimer(QDeadlineTimer::Forever);
        } else {
            deadline = QDeadlineTimer(QDeadlineTimer::Forever);
        }
    } else {
        // Using the default-constructed `deadline`, which is already expired,
        // ensures the code in the do-while loop in qt_safe_poll runs at least once.
    }

    d->pollfds.clear();
    d->pollfds.reserve(1 + (include_notifiers ? d->socketNotifiers.size() : 0));

    if (include_notifiers)
        for (auto it = d->socketNotifiers.cbegin(); it != d->socketNotifiers.cend(); ++it)
            d->pollfds.append(qt_make_pollfd(it.key(), it.value().events()));

    // This must be last, as it's popped off the end below
    d->pollfds.append(d->threadPipe.prepare());

    int nevents = 0;
    switch (qt_safe_poll(d->pollfds.data(), d->pollfds.size(), deadline)) {
    case -1:
        qErrnoWarning("qt_safe_poll");
        if (QT_CONFIG(poll_exit_on_error))
            abort();
        break;
    case 0:
        break;
    default:
        nevents += d->threadPipe.check(d->pollfds.takeLast());
        if (include_notifiers)
            nevents += d->activateSocketNotifiers();
        break;
    }

    if (include_timers)
        nevents += d->activateTimers();

    // return true if we handled events, false otherwise
    return (nevents > 0);
}